

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

_Bool MatrixCompareLoose(Matrix *a,Matrix *b,Real error)

{
  ulong uVar1;
  _Bool _Var2;
  uint32_t col;
  uint uVar3;
  uint uVar4;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar6;
  
  uVar3 = a->rows;
  if ((uVar3 == b->rows) && (a->columns == b->columns)) {
    lVar6 = in_ST6;
    for (uVar4 = 0; uVar1 = (ulong)uVar3, uVar4 < uVar3; uVar4 = uVar4 + 1) {
      uVar3 = 0;
      while (uVar3 < a->columns) {
        MatrixGetElement((Real *)a,(Matrix *)(ulong)uVar4,uVar3,(uint32_t)uVar1);
        MatrixGetElement((Real *)b,(Matrix *)(ulong)uVar4,uVar3,(uint32_t)uVar1);
        lVar5 = in_ST0 - in_ST1;
        uVar3 = uVar3 + 1;
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        in_ST2 = in_ST4;
        in_ST3 = in_ST5;
        in_ST4 = in_ST6;
        in_ST5 = lVar6;
        in_ST6 = lVar6;
        if (error._0_10_ <= ABS(lVar5)) {
          return false;
        }
      }
      uVar3 = a->rows;
    }
    _Var2 = true;
  }
  else {
    _Var2 = false;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixCompareLoose");
  }
  return _Var2;
}

Assistant:

bool MatrixCompareLoose(const Matrix *a, const Matrix *b, Real error) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return false;
  }
#endif
  for (uint32_t row = 0; row < a->rows; ++row) {
    for (uint32_t col = 0; col < a->columns; ++col) {
      if (fabsl(MatrixGetElement(a, row, col) - MatrixGetElement(b, row, col)) >= error) {
        return false;
      }
    }
  }
  return true;
}